

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

void wwTrimHi(word *a,size_t n,size_t pos)

{
  ulong uVar1;
  byte bVar2;
  
  uVar1 = pos >> 6;
  if (uVar1 < n) {
    if ((pos & 0x3f) == 0) goto LAB_0014f575;
    bVar2 = -(char)(pos & 0x3f);
    a[uVar1] = (a[uVar1] << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
    while (uVar1 = uVar1 + 1, uVar1 < n) {
LAB_0014f575:
      a[uVar1] = 0;
    }
  }
  return;
}

Assistant:

void wwTrimHi(word a[], size_t n, size_t pos)
{
	size_t i = pos / B_PER_W;
	ASSERT(wwIsValid(a, n));
	if (i < n)
	{
		pos = B_PER_W - pos % B_PER_W;
		// очистить биты слова a[i]
		if (pos == B_PER_W)
			a[i] = 0;
		else
			a[i] <<= pos, a[i] >>= pos;
		// очистить остальные слова
		while (++i < n)
			a[i] = 0;
	}
}